

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Deserializer::ReadUint32FromBigEndian(Deserializer *this)

{
  uint uVar1;
  bool bVar2;
  uchar *puVar3;
  uint32_t local_14;
  uint8_t tmp_buf [4];
  uint32_t result;
  Deserializer *this_local;
  
  CheckReadSize(this,4);
  bVar2 = IsBigEndian();
  if (bVar2) {
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e7bcd);
    local_14 = *(uint32_t *)(puVar3 + this->offset_);
  }
  else {
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e7be9);
    uVar1 = *(uint *)(puVar3 + this->offset_);
    local_14 = (uVar1 >> 0x18) + (uVar1 >> 0x10 & 0xff) * 0x100 + (uVar1 >> 8 & 0xff) * 0x10000 +
               uVar1 * 0x1000000;
  }
  this->offset_ = this->offset_ + 4;
  return local_14;
}

Assistant:

uint32_t Deserializer::ReadUint32FromBigEndian() {
  uint32_t result = 0;
  CheckReadSize(sizeof(result));
  if (IsBigEndian()) {
    memcpy(&result, &buffer_.data()[offset_], sizeof(result));
  } else {
    uint8_t tmp_buf[4];
    memcpy(tmp_buf, &buffer_.data()[offset_], sizeof(tmp_buf));
    result = static_cast<uint32_t>(tmp_buf[3] & 0x000000ff) +
             static_cast<uint32_t>((tmp_buf[2] << 8) & 0x0000ff00) +
             static_cast<uint32_t>((tmp_buf[1] << 16) & 0x00ff0000) +
             static_cast<uint32_t>((tmp_buf[0] << 24) & 0xff000000);
  }
  offset_ += sizeof(result);
  return result;
}